

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

BOOL __thiscall
Js::GlobalObject::SetRootProperty
          (GlobalObject *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  BOOL local_3c;
  PropertyValueInfo *pPStack_38;
  BOOL setAttempted;
  
  if ((flags & PropertyOperation_Root) == PropertyOperation_None) {
    AssertCount = AssertCount + 1;
    pPStack_38 = info;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x7d9,"(flags & PropertyOperation_Root)",
                                "flags & PropertyOperation_Root");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    info = pPStack_38;
  }
  local_3c = 1;
  BVar3 = SetExistingRootProperty(this,propertyId,value,info,&local_3c);
  BVar4 = 1;
  if (BVar3 == 0) {
    BVar4 = 0;
    if (local_3c == 0) {
      this_00 = (((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr
                   )->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      pPStack_38 = info;
      if ((flags & PropertyOperation_StrictMode) == PropertyOperation_None) {
        ScriptContext::InvalidateProtoCaches(this_00,propertyId);
        BVar4 = RootObjectBase::SetRootProperty
                          (&this->super_RootObjectBase,propertyId,value,flags,pPStack_38);
        return BVar4;
      }
      bVar2 = ThreadContext::RecordImplicitException(this_00->threadContext);
      BVar4 = 0;
      if (bVar2) {
        JavascriptError::ThrowReferenceError
                  ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.
                      ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                   -0x7ff5ec4e,(PCWSTR)0x0);
      }
    }
  }
  return BVar4;
}

Assistant:

BOOL GlobalObject::SetRootProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(flags & PropertyOperation_Root);

        BOOL setAttempted = TRUE;
        if (this->SetExistingRootProperty(propertyId, value, info, &setAttempted))
        {
            return TRUE;
        }

        //
        // Set was attempted. But the set operation returned false.
        // This happens, when the property is read only.
        // In those scenarios, we should be setting the property with default attributes
        //
        if (setAttempted)
        {
            return FALSE;
        }

        if (flags & PropertyOperation_StrictMode)
        {
            if (!GetScriptContext()->GetThreadContext()->RecordImplicitException())
            {
                return FALSE;
            }
            JavascriptError::ThrowReferenceError(GetScriptContext(), JSERR_RefErrorUndefVariable);
        }

        // Windows 8 430092: When we set a new property on globalObject there may be stale inline caches holding onto directHostObject->prototype
        // properties of the same name. So we need to clear proto caches in this scenario. But check for same property in directHostObject->prototype
        // chain is expensive (call to DOM) compared to just invalidating the cache.
        // If this blind invalidation is expensive in any scenario then we need to revisit this.
        // Another solution proposed was not to cache any of the properties of window->directHostObject->prototype.
        // if ((this->directHostObject && JavascriptOperators::HasProperty(this->directHostObject->GetPrototype(), propertyId)) ||
        //    (this->hostObject && JavascriptOperators::HasProperty(this->hostObject->GetPrototype(), propertyId)))

        this->GetScriptContext()->InvalidateProtoCaches(propertyId);

        return __super::SetRootProperty(propertyId, value, flags, info);
    }